

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(h__Writer *this,AudioDescriptor *ADesc)

{
  Rational RVar1;
  Rational RVar2;
  i32_t iVar3;
  i32_t iVar4;
  i32_t iVar5;
  i32_t iVar6;
  i32_t iVar7;
  i32_t iVar8;
  i32_t iVar9;
  bool bVar10;
  int iVar11;
  ui32_t BytesPerEditUnit;
  ILogSink *pIVar12;
  Rational *pRVar13;
  byte_t *pbVar14;
  Rational *in_RDX;
  Rational local_178;
  UL local_168;
  UL local_148;
  string local_128;
  undefined1 local_108 [104];
  h__WriterState local_a0 [31];
  undefined1 local_21;
  Rational *local_20;
  AudioDescriptor *ADesc_local;
  h__Writer *this_local;
  Result_t *result;
  
  local_20 = in_RDX;
  ADesc_local = ADesc;
  this_local = this;
  bVar10 = MXF::h__WriterState::Test_INIT((h__WriterState *)&ADesc[0x12].Locked);
  if (bVar10) {
    bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_24);
    if ((((((bVar10) &&
           (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_25), bVar10)) &&
          (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_30), bVar10)) &&
         ((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_48), bVar10 &&
          (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_50), bVar10)))) &&
        (((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_60), bVar10 &&
          ((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_96), bVar10 &&
           (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_100), bVar10)))) &&
         (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_120), bVar10)))) &&
       ((((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_192), bVar10 &&
          (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_200), bVar10)) &&
         (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_240), bVar10)) &&
        (((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_16), bVar10 &&
          (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_18), bVar10)) &&
         ((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_20), bVar10 &&
          ((bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_22), bVar10 &&
           (bVar10 = Rational::operator!=(local_20,(Rational *)&ASDCP::EditRate_23_98), bVar10))))))
        )))) {
      pIVar12 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (pIVar12,"AudioDescriptor.EditRate is not a supported value: %d/%d\n",
                 (ulong)(uint)local_20->Numerator,(ulong)(uint)local_20->Denominator);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RAW_FORMAT);
    }
    else {
      bVar10 = Rational::operator!=(local_20 + 1,(Rational *)&ASDCP::SampleRate_48k);
      if ((bVar10) &&
         (bVar10 = Rational::operator!=(local_20 + 1,(Rational *)&ASDCP::SampleRate_96k), bVar10)) {
        pIVar12 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar12,"AudioDescriptor.AudioSamplingRate is not 48000/1 or 96000/1: %d/%d\n",
                   (ulong)(uint)local_20[1].Numerator,(ulong)(uint)local_20[1].Denominator);
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RAW_FORMAT);
      }
      else {
        if (ADesc->AudioSamplingRate == (Rational)0x0) {
          __assert_fail("m_Dict",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_PCM.cpp"
                        ,0x25a,
                        "ASDCP::Result_t ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(const AudioDescriptor &)"
                       );
        }
        RVar1 = *local_20;
        RVar2 = local_20[1];
        iVar6 = local_20[2].Numerator;
        iVar7 = local_20[2].Denominator;
        iVar8 = local_20[3].Numerator;
        iVar9 = local_20[3].Denominator;
        iVar3 = local_20[4].Denominator;
        iVar4 = local_20[5].Numerator;
        iVar5 = local_20[5].Denominator;
        ADesc[0x25].AvgBps = local_20[4].Numerator;
        ADesc[0x25].LinkedTrackID = iVar3;
        ADesc[0x25].ContainerDuration = iVar4;
        ADesc[0x25].ChannelFormat = iVar5;
        ADesc[0x25].Locked = iVar6;
        ADesc[0x25].ChannelCount = iVar7;
        ADesc[0x25].QuantizationBits = iVar8;
        ADesc[0x25].BlockAlign = iVar9;
        ADesc[0x25].EditRate = RVar1;
        ADesc[0x25].AudioSamplingRate = RVar2;
        local_21 = 0;
        PCM_ADesc_to_MD((ASDCP *)this,ADesc + 0x25,
                        *(WaveAudioDescriptor **)&ADesc[0x10].QuantizationBits);
        iVar11 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
        if (-1 < iVar11) {
          pRVar13 = (Rational *)
                    Dictionary::ul((Dictionary *)ADesc->AudioSamplingRate,MDD_WAVEssence);
          RVar1 = pRVar13[1];
          ADesc[0x26].EditRate = *pRVar13;
          ADesc[0x26].AudioSamplingRate = RVar1;
          *(undefined1 *)((long)&ADesc[0x26].AudioSamplingRate.Denominator + 3) = 1;
          MXF::h__WriterState::Goto_READY(local_a0);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
          Kumu::Result_t::~Result_t((Result_t *)local_a0);
        }
        iVar11 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
        if (-1 < iVar11) {
          pbVar14 = Dictionary::ul((Dictionary *)ADesc->AudioSamplingRate,MDD_WAVWrappingFrame);
          UL::UL((UL *)&local_128,pbVar14);
          UL::UL(&local_148,(byte_t *)(ADesc + 0x26));
          pbVar14 = Dictionary::ul((Dictionary *)ADesc->AudioSamplingRate,MDD_SoundDataDef);
          UL::UL(&local_168,pbVar14);
          MXF::Rational::Rational(&local_178,&ADesc[0x25].EditRate);
          BytesPerEditUnit = derive_timecode_rate_from_edit_rate(&ADesc[0x25].EditRate);
          calc_CBR_frame_size((WriterInfo *)&ADesc[0x12].QuantizationBits,ADesc + 0x25);
          h__ASDCPWriter::WriteASDCPHeader
                    ((h__ASDCPWriter *)local_108,(string *)ADesc,(UL *)&PCM_PACKAGE_LABEL_abi_cxx11_
                     ,&local_128,(UL *)&SOUND_DEF_LABEL_abi_cxx11_,&local_148,(Rational *)&local_168
                     ,(ui32_t)&local_178,BytesPerEditUnit);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_108);
          Kumu::Result_t::~Result_t((Result_t *)local_108);
          MXF::Rational::~Rational(&local_178);
          UL::~UL(&local_168);
          UL::~UL(&local_148);
          UL::~UL((UL *)&local_128);
        }
      }
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(const AudioDescriptor& ADesc)
{
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( ADesc.EditRate != EditRate_24
       && ADesc.EditRate != EditRate_25
       && ADesc.EditRate != EditRate_30
       && ADesc.EditRate != EditRate_48
       && ADesc.EditRate != EditRate_50
       && ADesc.EditRate != EditRate_60
       && ADesc.EditRate != EditRate_96
       && ADesc.EditRate != EditRate_100
       && ADesc.EditRate != EditRate_120
       && ADesc.EditRate != EditRate_192
       && ADesc.EditRate != EditRate_200
       && ADesc.EditRate != EditRate_240
       && ADesc.EditRate != EditRate_16
       && ADesc.EditRate != EditRate_18
       && ADesc.EditRate != EditRate_20
       && ADesc.EditRate != EditRate_22
       && ADesc.EditRate != EditRate_23_98 )
    {
      DefaultLogSink().Error("AudioDescriptor.EditRate is not a supported value: %d/%d\n",
			     ADesc.EditRate.Numerator, ADesc.EditRate.Denominator);
      return RESULT_RAW_FORMAT;
    }

  if ( ADesc.AudioSamplingRate != SampleRate_48k && ADesc.AudioSamplingRate != SampleRate_96k )
    {
      DefaultLogSink().Error("AudioDescriptor.AudioSamplingRate is not 48000/1 or 96000/1: %d/%d\n",
			     ADesc.AudioSamplingRate.Numerator, ADesc.AudioSamplingRate.Denominator);
      return RESULT_RAW_FORMAT;
    }

  assert(m_Dict);
  m_ADesc = ADesc;

  Result_t result = PCM_ADesc_to_MD(m_ADesc, (WaveAudioDescriptor*)m_EssenceDescriptor);
  
  if ( ASDCP_SUCCESS(result) )
    {
      memcpy(m_EssenceUL, m_Dict->ul(MDD_WAVEssence), SMPTE_UL_LENGTH);
      m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
      result = m_State.Goto_READY();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = WriteASDCPHeader(PCM_PACKAGE_LABEL, UL(m_Dict->ul(MDD_WAVWrappingFrame)),
				SOUND_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_SoundDataDef)),
				m_ADesc.EditRate, derive_timecode_rate_from_edit_rate(m_ADesc.EditRate),
				calc_CBR_frame_size(m_Info, m_ADesc));
    }

  return result;
}